

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

ostream * operator<<(ostream *Out,TPZVec<int> *v)

{
  long lVar1;
  ostream *this;
  int64_t ii;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = "";
  if (*(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10) == 0) {
    pcVar4 = ", ";
  }
  lVar1 = v->fNElements;
  lVar3 = (long)(int)*(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10);
  if (lVar1 != 0) {
    *(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10) = lVar3;
    std::ostream::operator<<(Out,*v->fStore);
  }
  for (lVar2 = 1; lVar2 < lVar1; lVar2 = lVar2 + 1) {
    *(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10) = lVar3;
    this = std::operator<<(Out,pcVar4);
    std::ostream::operator<<(this,v->fStore[lVar2]);
  }
  return Out;
}

Assistant:

std::ostream& operator<<( std::ostream& Out, const TPZVec< T >& v )
{
	std::streamsize width = Out.width();
	
	const char* sep = ( width == 0 ? ", " : "" );
	
	int64_t size = v.NElements();
	
	if(size) Out << std::setw(width) << v.fStore[0];
	
	for( int64_t ii = 1; ii < size; ii++ )
	{
	    Out << std::setw( width ) << sep << v.fStore[ ii ];
	}
	
	return Out;
}